

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

ostream * doctest::operator<<(ostream *stream,String *in)

{
  char *__s;
  size_t sVar1;
  
  __s = in->m_str;
  if (__s == (char *)0x0) {
    std::ios::clear((int)stream + (int)stream->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const String& in) {
    stream << in.c_str();
    return stream;
}